

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O2

int gauden_floor_variance(gauden_t *g)

{
  uint uVar1;
  vector_t *ppfVar2;
  vector_t pfVar3;
  float32 fVar4;
  uint32 i;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  float64 fVar10;
  
  if (g->fullvar != (vector_t ****)0x0) {
    for (uVar8 = 0; uVar8 < g->n_mgau; uVar8 = uVar8 + 1) {
      for (uVar9 = 0; uVar9 < g->n_feat; uVar9 = uVar9 + 1) {
        for (uVar7 = 0; uVar7 < g->n_density; uVar7 = uVar7 + 1) {
          fVar10 = determinant((float32 **)g->fullvar[uVar8][uVar9][uVar7],g->veclen[uVar9]);
          fVar4 = min_var;
          if ((double)fVar10 <= 0.0) {
            ppfVar2 = g->fullvar[uVar8][uVar9][uVar7];
            uVar1 = g->veclen[uVar9];
            for (uVar5 = 0; uVar5 != uVar1; uVar5 = uVar5 + 1) {
              for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
                pfVar3 = ppfVar2[uVar5];
                if (uVar5 == uVar6) {
                  if (pfVar3[uVar5] <= (float)fVar4 && (float)fVar4 != pfVar3[uVar5]) {
                    pfVar3[uVar5] = (float)fVar4;
                  }
                }
                else {
                  pfVar3[uVar6] = 0.0;
                }
              }
            }
          }
        }
      }
    }
  }
  if (g->var != (vector_t ***)0x0) {
    for (uVar8 = 0; uVar8 < g->n_mgau; uVar8 = uVar8 + 1) {
      for (uVar9 = 0; uVar9 < g->n_feat; uVar9 = uVar9 + 1) {
        for (uVar7 = 0; uVar7 < g->n_density; uVar7 = uVar7 + 1) {
          vector_floor(g->var[uVar8][uVar9][uVar7],g->veclen[uVar9],min_var);
        }
      }
    }
  }
  return 0;
}

Assistant:

int
gauden_floor_variance(gauden_t *g)
{
    uint32 i, j, k;

    if (g->fullvar != NULL) {
	/* Don't try to "floor" full covariances since there's no easy
	   way to do this.  If they are singular, discard the
	   off-diagonals and floor the diagonals. */
	for (i = 0; i < g->n_mgau; i++) {
	    for (j = 0; j < g->n_feat; j++) {
		for (k = 0; k < g->n_density; k++) {
		    if (determinant(g->fullvar[i][j][k], g->veclen[j]) <= 0.0) {
			diag_and_floor(g->fullvar[i][j][k], g->veclen[j], min_var);
		    }
		}
	    }
	}
    }
    if (g->var != NULL) {
	for (i = 0; i < g->n_mgau; i++) {
	    for (j = 0; j < g->n_feat; j++) {
		for (k = 0; k < g->n_density; k++) {
		    vector_floor(g->var[i][j][k], g->veclen[j], min_var);
		}
	    }
	}
    }

    return S3_SUCCESS;
}